

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

ulong tidyOptGetDefaultInt(TidyOption topt)

{
  TidyOptionImpl *pTVar1;
  TidyOptionImpl *newopt;
  TidyOptionImpl *option;
  TidyOption topt_local;
  
  if ((topt == (TidyOption)0x0) || (topt[4]._opaque == 0)) {
    if (topt->_opaque == 0xd) {
      pTVar1 = prvTidygetOption(TidyDoctypeMode);
      topt_local = (TidyOption)pTVar1->dflt;
    }
    else {
      topt_local = (TidyOption)0xffffffff;
    }
  }
  else {
    topt_local = *(TidyOption *)(topt + 6);
  }
  return (ulong)topt_local;
}

Assistant:

ulong TIDY_CALL          tidyOptGetDefaultInt( TidyOption topt )
{
    const TidyOptionImpl* option = tidyOptionToImpl( topt );
    if ( option && option->type != TidyString )
        return option->dflt;

    /* Special case for TidyDoctype, because it has a picklist */
    if ( option->id == TidyDoctype )
    {
        const TidyOptionImpl* newopt = TY_(getOption)( TidyDoctypeMode );
        return newopt->dflt;
    }

    return ~0U;
}